

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O2

object_ptr __thiscall
mjs::make_array(mjs *this,gc_heap_ptr<mjs::global_object> *global,
               vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  pointer pvVar1;
  gc_heap *h;
  long *plVar2;
  global_object *g;
  uint32_t index;
  undefined8 extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *this_00;
  uint uVar3;
  mjs *this_01;
  double n;
  object_ptr oVar4;
  gc_heap_ptr<mjs::array_object> arr;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_80 [2];
  wstring_view local_60;
  object_ptr array_prototype;
  gc_heap_ptr_untyped local_40;
  
  plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar2 + 0x70))(&array_prototype,plVar2);
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pvVar1 == 0x28) && (pvVar1->type_ == number))
  {
    g = (global_object *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    n = value::number_value((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                            _M_impl.super__Vector_impl_data._M_start);
    anon_unknown_110::check_array_length(g,n);
    array_object::make((gc_heap_ptr<mjs::global_object> *)local_80,(uint32_t)global);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)this,(gc_heap_ptr_untyped *)local_80);
    this_00 = local_80;
  }
  else {
    array_object::make((gc_heap_ptr<mjs::global_object> *)&arr,(uint32_t)global);
    uVar3 = 0;
    while( true ) {
      this_01 = (mjs *)(ulong)uVar3;
      if ((mjs *)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                        super__Vector_impl_data._M_start) / 0x28) <= this_01) break;
      plVar2 = (long *)gc_heap_ptr_untyped::get(&arr.super_gc_heap_ptr_untyped);
      h = (global->super_gc_heap_ptr_untyped).heap_;
      index_string_abi_cxx11_((wstring *)local_80,this_01,index);
      local_60._M_len = local_80[0]._8_8_;
      local_60._M_str = (wchar_t *)local_80[0]._0_8_;
      string::string((string *)&local_40,h,&local_60);
      (**(code **)(*plVar2 + 8))
                (plVar2,&local_40,
                 (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                 super__Vector_impl_data._M_start + (long)this_01,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
      std::__cxx11::wstring::~wstring((wstring *)local_80);
      uVar3 = uVar3 + 1;
    }
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)this,&arr.super_gc_heap_ptr_untyped);
    this_00 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)&arr;
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this_00);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&array_prototype.super_gc_heap_ptr_untyped);
  oVar4.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar4.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar4.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr make_array(const gc_heap_ptr<global_object>& global, const std::vector<value>& args) {
    auto array_prototype = global->array_prototype();
    if (args.size() == 1 && args[0].type() == value_type::number) {
        return array_object::make(global, check_array_length(*global, args[0].number_value()));
    }
    auto arr = array_object::make(global, static_cast<uint32_t>(args.size()));
    for (uint32_t i = 0; i < args.size(); ++i) {
        arr->put(string{global.heap(), index_string(i)}, args[i], property_attribute::none);
    }
    return arr;
}